

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cpp
# Opt level: O2

void crc32_init(void)

{
  ulong uVar1;
  ulong uVar2;
  int i;
  ulong uVar3;
  int t;
  long lVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  if (_tableInitialized == '\0') {
    for (uVar3 = 0; uVar3 != 0x100; uVar3 = uVar3 + 1) {
      uVar5 = uVar3 & 0xffffffff;
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        iVar6 = 8;
        while( true ) {
          bVar7 = iVar6 == 0;
          iVar6 = iVar6 + -1;
          if (bVar7) break;
          uVar1 = uVar5 >> 1;
          uVar2 = uVar5 & 1;
          uVar5 = (ulong)((uint)uVar1 ^ 0x82f63b78);
          if (uVar2 == 0) {
            uVar5 = uVar1;
          }
        }
        table[lVar4][uVar3] = (uint32_t)uVar5;
      }
    }
    _tableInitialized = '\x01';
  }
  return;
}

Assistant:

void crc32_init()
{
	if (_tableInitialized) return;

	for(int i = 0; i < 256; i++) 
	{
		uint32_t res = (uint32_t)i;
		for(int t = 0; t < 16; t++) {
			for (int k = 0; k < 8; k++) res = (res & 1) == 1 ? POLY ^ (res >> 1) : (res >> 1);
			table[t][i] = res;
		}
	}

	_tableInitialized = true;
}